

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<float>::DeterminantInverse
          (TPZFMatrix<float> *this,float *determinant,TPZFMatrix<float> *inverse)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  TPZFNMatrix<100,_float> copy;
  TPZFMatrix<float> local_258;
  float local_1c8 [102];
  
  local_258.fElem = local_1c8;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01837020;
  local_258.fSize = 100;
  local_258.fGiven = local_258.fElem;
  TPZVec<int>::TPZVec(&local_258.fPivot.super_TPZVec<int>,0);
  local_258.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_258.fPivot.super_TPZVec<int>.fStore = local_258.fPivot.fExtAlloc;
  local_258.fPivot.super_TPZVec<int>.fNElements = 0;
  local_258.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_258.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_258.fWork.fStore = (float *)0x0;
  local_258.fWork.fNElements = 0;
  local_258.fWork.fNAlloc = 0;
  local_258.fElem = (float *)0x0;
  local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01836d30;
  operator=(&local_258,this);
  (*(inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (inverse);
  lVar1 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  if (0 < lVar1) {
    lVar3 = (inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
    lVar4 = 0;
    do {
      if ((lVar3 <= lVar4) || ((inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar4))
      {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      inverse->fElem[lVar3 * lVar4 + lVar4] = 1.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar1);
  }
  iVar2 = (*local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x10])();
  if (iVar2 != 0) {
    TPZMatrix<float>::Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
  }
  iVar2 = (*local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x17])();
  if (iVar2 != 0) {
    (*local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x43])
              (&local_258,inverse);
  }
  *determinant = 1.0;
  lVar1 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  if (0 < lVar1) {
    fVar5 = 1.0;
    lVar3 = 0;
    do {
      if ((local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar3) ||
         (local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar3)) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      fVar5 = fVar5 * local_258.fElem
                      [local_258.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * lVar3 + lVar3];
      *determinant = fVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar1);
  }
  ~TPZFMatrix(&local_258,&PTR_PTR_01836fe8);
  return;
}

Assistant:

void TPZFMatrix<TVar>::DeterminantInverse(TVar &determinant, TPZFMatrix<TVar> &inverse)
{
    TPZFNMatrix<100, TVar> copy(*this);
    inverse.Redim(this->Rows(),this->Rows());
    int64_t r;
    for(r=0; r<this->Rows(); r++) inverse(r,r) = 1.;
    copy.Solve_LU(&inverse);
    determinant = 1.;
    for(r=0; r<this->Rows(); r++) determinant *= copy(r,r);
}